

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void * WebPSafeCalloc(uint64_t nmemb,size_t size)

{
  int iVar1;
  uint64_t in_RSI;
  size_t in_RDI;
  void *ptr;
  size_t in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  iVar1 = CheckSizeArgumentsOverflow(in_RSI,in_stack_ffffffffffffffe0);
  if (iVar1 == 0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = calloc(in_RDI,in_RSI);
  }
  return local_8;
}

Assistant:

void* WebPSafeCalloc(uint64_t nmemb, size_t size) {
  void* ptr;
  Increment(&num_calloc_calls);
  if (!CheckSizeArgumentsOverflow(nmemb, size)) return NULL;
  assert(nmemb * size > 0);
  ptr = calloc((size_t)nmemb, size);
  AddMem(ptr, (size_t)(nmemb * size));
  return ptr;
}